

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLookupResultValid
               (Texture3DView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  ConstPixelBufferAccess *level;
  ConstPixelBufferAccess *level_00;
  float __x;
  int iVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  bool bVar13;
  int i;
  uint uVar14;
  TextureChannelClass TVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int y1;
  int z;
  int z_00;
  int iVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  FilterMode FVar31;
  int c;
  uint uVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [12];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  uint auStack_528 [3];
  float local_51c;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_5;
  Vector<float,_4> res_8;
  Vector<float,_4> res_12;
  Vector<float,_4> res_11;
  Vec4 maxVal;
  int local_434;
  float local_430;
  Vector<float,_4> res_27;
  Vec4 minVal;
  undefined1 local_3c8 [16];
  Vector<float,_4> res_45;
  Vector<float,_4> res_46;
  uint local_37c;
  int local_364;
  Vec2 local_310;
  Vec2 wBounds1;
  Vec2 wBounds0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vector<float,_4> res_56;
  float a0;
  Vector<float,_4> res_70;
  Vector<float,_4> res_71;
  ColorQuad quad00;
  ColorQuad quad10;
  ColorQuad quad01;
  Vec2 uBounds0_1;
  float local_138 [12];
  undefined1 local_108 [16];
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  undefined1 local_88 [16];
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  Vector<float,_4> res_81;
  undefined4 uStack_3c;
  
  fVar51 = lodBounds->m_data[0];
  __x = lodBounds->m_data[1];
  fVar36 = sampler->lodThreshold;
  if ((fVar51 <= fVar36) &&
     (bVar12 = isLevelSampleResultValid
                         (texture->m_levels,sampler,sampler->magFilter,prec,coord,result), bVar12))
  {
    return true;
  }
  if (__x <= fVar36) {
    return false;
  }
  FVar31 = sampler->minFilter;
  iVar34 = texture->m_numLevels;
  iVar33 = iVar34 + -1;
  if (iVar33 < 1 || (FVar31 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
    if ((FVar31 == LINEAR_MIPMAP_NEAREST) || (FVar31 == NEAREST_MIPMAP_NEAREST)) {
      fVar51 = ceilf(fVar51 + 0.5);
      iVar25 = (int)fVar51 + -1;
      iVar34 = iVar33;
      if (iVar25 < iVar33) {
        iVar34 = iVar25;
      }
      if (iVar25 < 0) {
        iVar34 = 0;
      }
      fVar51 = floorf(__x + 0.5);
      iVar25 = (int)fVar51;
      if (iVar25 < iVar33) {
        iVar33 = iVar25;
      }
      if (iVar25 < 0) {
        iVar33 = 0;
      }
      for (; iVar34 <= iVar33; iVar34 = iVar34 + 1) {
        uVar32 = sampler->minFilter - LINEAR;
        FVar31 = NEAREST;
        if (uVar32 < 5) {
          FVar31 = *(FilterMode *)(&DAT_00bc26d8 + (ulong)uVar32 * 4);
        }
        bVar12 = isLevelSampleResultValid
                           (texture->m_levels + iVar34,sampler,FVar31,prec,coord,result);
        if (bVar12) {
          bVar12 = true;
          goto LAB_00abb4f3;
        }
      }
      bVar12 = false;
LAB_00abb4f3:
      if (iVar34 <= iVar33) goto LAB_00abb4a7;
    }
    else {
      bVar13 = isLevelSampleResultValid(texture->m_levels,sampler,FVar31,prec,coord,result);
      bVar12 = true;
      if (bVar13) goto LAB_00abb4a7;
    }
  }
  else {
    fVar36 = floorf(fVar51);
    uVar14 = (uint)fVar36;
    uVar32 = iVar34 - 2;
    local_37c = uVar32;
    if ((int)uVar14 < (int)uVar32) {
      local_37c = uVar14;
    }
    if ((int)uVar14 < 0) {
      local_37c = 0;
    }
    fVar36 = floorf(__x);
    uVar14 = (uint)fVar36;
    if ((int)uVar14 < (int)uVar32) {
      uVar32 = uVar14;
    }
    local_98 = (ulong)uVar32;
    if ((int)uVar14 < 0) {
      local_98 = 0;
    }
    do {
      local_a0 = (ulong)local_37c;
      iVar33 = (int)local_98;
      if (iVar33 < (int)local_37c) {
        bVar12 = false;
        local_a0._0_4_ = local_37c;
        goto LAB_00abb4a0;
      }
      fVar36 = fVar51 - (float)(int)local_37c;
      local_310.m_data[0] = 1.0;
      if (fVar36 <= 1.0) {
        local_310.m_data[0] = fVar36;
      }
      local_310.m_data[0] = (float)(~-(uint)(fVar36 < 0.0) & (uint)local_310.m_data[0]);
      fVar36 = __x - (float)(int)local_37c;
      local_310.m_data[1] = 1.0;
      if (fVar36 <= 1.0) {
        local_310.m_data[1] = fVar36;
      }
      local_310.m_data[1] = (float)(~-(uint)(fVar36 < 0.0) & (uint)local_310.m_data[1]);
      level = texture->m_levels + (int)local_37c;
      local_37c = local_37c + 1;
      level_00 = texture->m_levels + (int)local_37c;
      if ((sampler->minFilter < FILTERMODE_LAST) &&
         ((0x32U >> (sampler->minFilter & 0x1f) & 1) != 0)) {
        iVar33 = (level->m_size).m_data[0];
        iVar34 = (level->m_size).m_data[1];
        iVar25 = (level_00->m_size).m_data[0];
        iVar1 = (level_00->m_size).m_data[1];
        iVar2 = (level->m_size).m_data[2];
        iVar16 = (level_00->m_size).m_data[2];
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,iVar33,coord->m_data[0],
                   (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,iVar25,coord->m_data[0],
                   (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,iVar34,coord->m_data[1],
                   (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,iVar1,coord->m_data[1],
                   (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&wBounds0,sampler->normalizedCoords,iVar2,coord->m_data[2],
                   (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&wBounds1,sampler->normalizedCoords,iVar16,coord->m_data[2],
                   (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
        fVar36 = floorf(uBounds0.m_data[0] + -0.5);
        fVar37 = floorf(uBounds0.m_data[1] + -0.5);
        fVar38 = floorf(uBounds1.m_data[0] + -0.5);
        fVar39 = floorf(uBounds1.m_data[1] + -0.5);
        fVar40 = floorf(vBounds0.m_data[0] + -0.5);
        local_51c = floorf(vBounds0.m_data[1] + -0.5);
        fVar41 = floorf(vBounds1.m_data[0] + -0.5);
        local_3c8._0_4_ = fVar41;
        fVar42 = floorf(vBounds1.m_data[1] + -0.5);
        fVar43 = floorf(wBounds0.m_data[0] + -0.5);
        fVar44 = floorf(wBounds0.m_data[1] + -0.5);
        fVar45 = floorf(wBounds1.m_data[0] + -0.5);
        fVar46 = floorf(wBounds1.m_data[1] + -0.5);
        TVar15 = getTextureChannelClass((level->m_format).type);
        if (TVar15 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
          local_430 = computeBilinearSearchStepForSnorm(prec);
        }
        else {
          local_430 = 0.0;
          if (TVar15 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
            local_430 = computeBilinearSearchStepForUnorm(prec);
          }
        }
        iVar17 = (int)fVar43;
        if (iVar17 <= (int)fVar44) {
          iVar18 = (int)fVar38;
          iVar28 = (int)fVar39;
          iVar30 = (int)local_51c;
          do {
            if ((int)fVar40 <= iVar30) {
              uVar32 = (int)fVar40;
              do {
                local_90 = (ulong)uVar32;
                uVar14 = uVar32 + 1;
                local_364 = (int)fVar36;
                do {
                  if ((int)fVar37 < local_364) {
                    local_434 = 8;
                    break;
                  }
                  quad00.p11.m_data[0] = 0.0;
                  quad00.p11.m_data[1] = 0.0;
                  quad00.p11.m_data[2] = 0.0;
                  quad00.p11.m_data[3] = 0.0;
                  quad00.p10.m_data[0] = 0.0;
                  quad00.p10.m_data[1] = 0.0;
                  quad00.p10.m_data[2] = 0.0;
                  quad00.p10.m_data[3] = 0.0;
                  quad00.p01.m_data[0] = 0.0;
                  quad00.p01.m_data[1] = 0.0;
                  quad00.p01.m_data[2] = 0.0;
                  quad00.p01.m_data[3] = 0.0;
                  quad00.p00.m_data[0] = 0.0;
                  quad00.p00.m_data[1] = 0.0;
                  quad00.p00.m_data[2] = 0.0;
                  quad00.p00.m_data[3] = 0.0;
                  quad01.p11.m_data[0] = 0.0;
                  quad01.p11.m_data[1] = 0.0;
                  quad01.p11.m_data[2] = 0.0;
                  quad01.p11.m_data[3] = 0.0;
                  quad01.p10.m_data[0] = 0.0;
                  quad01.p10.m_data[1] = 0.0;
                  quad01.p10.m_data[2] = 0.0;
                  quad01.p10.m_data[3] = 0.0;
                  quad01.p01.m_data[0] = 0.0;
                  quad01.p01.m_data[1] = 0.0;
                  quad01.p01.m_data[2] = 0.0;
                  quad01.p01.m_data[3] = 0.0;
                  quad01.p00.m_data[0] = 0.0;
                  quad01.p00.m_data[1] = 0.0;
                  quad01.p00.m_data[2] = 0.0;
                  quad01.p00.m_data[3] = 0.0;
                  iVar19 = TexVerifierUtil::wrap(sampler->wrapS,local_364,iVar33);
                  iVar20 = TexVerifierUtil::wrap(sampler->wrapS,local_364 + 1,iVar33);
                  iVar21 = TexVerifierUtil::wrap(sampler->wrapT,(int)local_90,iVar34);
                  iVar22 = TexVerifierUtil::wrap(sampler->wrapT,uVar14,iVar34);
                  iVar23 = TexVerifierUtil::wrap(sampler->wrapR,iVar17,iVar2);
                  iVar24 = TexVerifierUtil::wrap(sampler->wrapR,iVar17 + 1,iVar2);
                  lookupQuad(&quad00,level,sampler,iVar19,iVar20,iVar21,iVar22,iVar23);
                  lookupQuad(&quad01,level,sampler,iVar19,iVar20,iVar21,iVar22,iVar24);
                  local_78 = local_430;
                  uStack_74 = 0;
                  uStack_70 = 0;
                  uStack_6c = 0;
                  if (TVar15 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                    fVar38 = computeBilinearSearchStepFromFloatQuad(prec,&quad00);
                    fVar39 = computeBilinearSearchStepFromFloatQuad(prec,&quad01);
                    local_78 = (float)(~-(uint)(fVar38 <= fVar39) & (uint)fVar39 |
                                      (uint)fVar38 & -(uint)(fVar38 <= fVar39));
                    uStack_74 = ~extraout_XMM0_Db & extraout_XMM0_Db_00 | extraout_XMM0_Db;
                    uStack_70 = ~extraout_XMM0_Dc & extraout_XMM0_Dc_00 | extraout_XMM0_Dc;
                    uStack_6c = ~extraout_XMM0_Dd & extraout_XMM0_Dd_00 | extraout_XMM0_Dd;
                  }
                  if ((int)fVar46 < (int)fVar45) {
                    local_434 = 0xb;
                  }
                  else {
                    fVar38 = (uBounds0.m_data[0] + -0.5) - (float)local_364;
                    auVar57 = ZEXT812(0x3f800000);
                    if (fVar38 <= 1.0) {
                      auVar57._4_8_ = 0;
                      auVar57._0_4_ = fVar38;
                    }
                    local_88._0_4_ = ~-(uint)(fVar38 < 0.0) & auVar57._0_4_;
                    local_88._4_4_ = 0;
                    local_88._8_4_ = auVar57._8_4_;
                    local_88._12_4_ = 0;
                    fVar38 = (uBounds0.m_data[1] + -0.5) - (float)local_364;
                    auVar52 = ZEXT812(0x3f800000);
                    if (fVar38 <= 1.0) {
                      auVar52._4_8_ = 0;
                      auVar52._0_4_ = fVar38;
                    }
                    local_68._0_4_ = ~-(uint)(fVar38 < 0.0) & auVar52._0_4_;
                    local_68._4_4_ = 0;
                    local_68._8_4_ = auVar52._8_4_;
                    local_68._12_4_ = 0;
                    fVar39 = (vBounds0.m_data[0] + -0.5) - (float)(int)uVar32;
                    fVar38 = 1.0;
                    if (fVar39 <= 1.0) {
                      fVar38 = fVar39;
                    }
                    fVar38 = (float)(~-(uint)(fVar39 < 0.0) & (uint)fVar38);
                    fVar39 = (vBounds0.m_data[1] + -0.5) - (float)(int)uVar32;
                    auVar53 = ZEXT812(0x3f800000);
                    if (fVar39 <= 1.0) {
                      auVar53._4_8_ = 0;
                      auVar53._0_4_ = fVar39;
                    }
                    local_108._0_4_ = ~-(uint)(fVar39 < 0.0) & auVar53._0_4_;
                    local_108._4_4_ = 0;
                    local_108._8_4_ = auVar53._8_4_;
                    local_108._12_4_ = 0;
                    fVar39 = (wBounds0.m_data[0] + -0.5) - (float)iVar17;
                    auVar54 = ZEXT812(0x3f800000);
                    if (fVar39 <= 1.0) {
                      auVar54._4_8_ = 0;
                      auVar54._0_4_ = fVar39;
                    }
                    fVar43 = (wBounds0.m_data[1] + -0.5) - (float)iVar17;
                    local_f8 = 1.0;
                    if (fVar43 <= 1.0) {
                      local_f8 = fVar43;
                    }
                    local_f8 = (float)(~-(uint)(fVar43 < 0.0) & (uint)local_f8);
                    uStack_f4 = 0;
                    uStack_f0 = 0;
                    uStack_ec = 0;
                    iVar19 = (int)fVar45;
                    do {
                      if ((int)fVar41 <= (int)fVar42) {
                        iVar20 = (int)fVar41;
                        do {
                          local_434 = 0x11;
                          bVar12 = iVar28 < iVar18;
                          if (iVar18 <= iVar28) {
                            bVar12 = false;
                            iVar21 = iVar18;
                            do {
                              quad10.p11.m_data[0] = 0.0;
                              quad10.p11.m_data[1] = 0.0;
                              quad10.p11.m_data[2] = 0.0;
                              quad10.p11.m_data[3] = 0.0;
                              quad10.p10.m_data[0] = 0.0;
                              quad10.p10.m_data[1] = 0.0;
                              quad10.p10.m_data[2] = 0.0;
                              quad10.p10.m_data[3] = 0.0;
                              quad10.p01.m_data[0] = 0.0;
                              quad10.p01.m_data[1] = 0.0;
                              quad10.p01.m_data[2] = 0.0;
                              quad10.p01.m_data[3] = 0.0;
                              quad10.p00.m_data[0] = 0.0;
                              quad10.p00.m_data[1] = 0.0;
                              quad10.p00.m_data[2] = 0.0;
                              quad10.p00.m_data[3] = 0.0;
                              local_138[8] = 0.0;
                              local_138[9] = 0.0;
                              local_138[10] = 0.0;
                              local_138[0xb] = 0.0;
                              local_138[4] = 0.0;
                              local_138[5] = 0.0;
                              local_138[6] = 0.0;
                              local_138[7] = 0.0;
                              local_138[0] = 0.0;
                              local_138[1] = 0.0;
                              local_138[2] = 0.0;
                              local_138[3] = 0.0;
                              uBounds0_1.m_data[0] = 0.0;
                              uBounds0_1.m_data[1] = 0.0;
                              iVar22 = TexVerifierUtil::wrap(sampler->wrapS,iVar21,iVar25);
                              c = iVar21 + 1;
                              iVar23 = TexVerifierUtil::wrap(sampler->wrapS,c,iVar25);
                              iVar24 = TexVerifierUtil::wrap(sampler->wrapT,iVar20,iVar1);
                              y1 = TexVerifierUtil::wrap(sampler->wrapT,iVar20 + 1,iVar1);
                              z = TexVerifierUtil::wrap(sampler->wrapR,iVar19,iVar16);
                              z_00 = TexVerifierUtil::wrap(sampler->wrapR,iVar19 + 1,iVar16);
                              lookupQuad(&quad10,level_00,sampler,iVar22,iVar23,iVar24,y1,z);
                              lookupQuad((ColorQuad *)&uBounds0_1,level_00,sampler,iVar22,iVar23,
                                         iVar24,y1,z_00);
                              fVar43 = local_430;
                              if (TVar15 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                                fVar43 = computeBilinearSearchStepFromFloatQuad(prec,&quad10);
                                fVar47 = computeBilinearSearchStepFromFloatQuad
                                                   (prec,(ColorQuad *)&uBounds0_1);
                                fVar43 = (float)(~-(uint)(fVar43 <= fVar47) & (uint)fVar47 |
                                                (uint)fVar43 & -(uint)(fVar43 <= fVar47));
                              }
                              fVar62 = (uBounds1.m_data[0] + -0.5) - (float)iVar21;
                              fVar63 = (uBounds1.m_data[1] + -0.5) - (float)iVar21;
                              fVar61 = (vBounds1.m_data[0] + -0.5) - (float)iVar20;
                              fVar65 = (vBounds1.m_data[1] + -0.5) - (float)iVar20;
                              fVar67 = (wBounds1.m_data[0] + -0.5) - (float)iVar19;
                              fVar47 = (wBounds1.m_data[1] + -0.5) - (float)iVar19;
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar64 = quad00.p01.m_data[lVar26];
                                fVar59 = quad00.p11.m_data[lVar26];
                                uVar35 = -(uint)(fVar64 <= fVar59);
                                res.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)fVar59 | (uint)fVar64 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              fVar64 = 1.0;
                              if (fVar63 <= 1.0) {
                                fVar64 = fVar63;
                              }
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar59 = quad00.p10.m_data[lVar26];
                                uVar35 = -(uint)(fVar59 <= res.m_data[lVar26]);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)fVar59 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              fVar59 = 1.0;
                              if (fVar47 <= 1.0) {
                                fVar59 = fVar47;
                              }
                              fVar66 = 1.0;
                              if (fVar65 <= 1.0) {
                                fVar66 = fVar65;
                              }
                              fVar3 = 1.0;
                              if (fVar67 <= 1.0) {
                                fVar3 = fVar67;
                              }
                              fVar59 = (float)(~-(uint)(fVar47 < 0.0) & (uint)fVar59);
                              maxVal.m_data[0] = 0.0;
                              maxVal.m_data[1] = 0.0;
                              maxVal.m_data[2] = 0.0;
                              maxVal.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar47 = quad00.p00.m_data[lVar26];
                                uVar35 = -(uint)(fVar47 <= res_1.m_data[lVar26]);
                                maxVal.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_1.m_data[lVar26] |
                                            (uint)fVar47 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              fVar47 = 1.0;
                              if (fVar61 <= 1.0) {
                                fVar47 = fVar61;
                              }
                              fVar47 = (float)(~-(uint)(fVar61 < 0.0) & (uint)fVar47);
                              local_3c8 = ZEXT416((uint)fVar47);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar61 = quad01.p01.m_data[lVar26];
                                fVar48 = quad01.p11.m_data[lVar26];
                                uVar35 = -(uint)(fVar61 <= fVar48);
                                res.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)fVar48 | (uint)fVar61 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              fVar61 = 1.0;
                              if (fVar62 <= 1.0) {
                                fVar61 = fVar62;
                              }
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar48 = quad01.p10.m_data[lVar26];
                                uVar35 = -(uint)(fVar48 <= res.m_data[lVar26]);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)fVar48 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              fVar66 = (float)(~-(uint)(fVar65 < 0.0) & (uint)fVar66);
                              res_5.m_data[0] = 0.0;
                              res_5.m_data[1] = 0.0;
                              res_5.m_data[2] = 0.0;
                              res_5.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad01.p00.m_data[lVar26];
                                uVar35 = -(uint)(fVar65 <= res_1.m_data[lVar26]);
                                res_5.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_1.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 4;
                              do {
                                fVar65 = quad10.p00.m_data[lVar26];
                                fVar48 = quad10.p10.m_data[lVar26];
                                uVar35 = -(uint)(fVar65 <= fVar48);
                                auStack_528[lVar26] = ~uVar35 & (uint)fVar48 | (uint)fVar65 & uVar35
                                ;
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 8);
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad10.p10.m_data[lVar26];
                                uVar35 = -(uint)(fVar65 <= res.m_data[lVar26]);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_8.m_data[0] = 0.0;
                              res_8.m_data[1] = 0.0;
                              res_8.m_data[2] = 0.0;
                              res_8.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad10.p00.m_data[lVar26];
                                uVar35 = -(uint)(fVar65 <= res_1.m_data[lVar26]);
                                res_8.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_1.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 4;
                              do {
                                uVar35 = -(uint)(uBounds0_1.m_data[lVar26] <= local_138[lVar26 + 4])
                                ;
                                auStack_528[lVar26] =
                                     ~uVar35 & (uint)local_138[lVar26 + 4] |
                                     (uint)uBounds0_1.m_data[lVar26] & uVar35;
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 8);
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(local_138[lVar26 + 4] <= res.m_data[lVar26]);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)local_138[lVar26 + 4] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_11.m_data[0] = 0.0;
                              res_11.m_data[1] = 0.0;
                              res_11.m_data[2] = 0.0;
                              res_11.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(uBounds0_1.m_data[lVar26] <= res_1.m_data[lVar26]);
                                res_11.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_1.m_data[lVar26] |
                                            (uint)uBounds0_1.m_data[lVar26] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_12.m_data[0] = 0.0;
                              res_12.m_data[1] = 0.0;
                              res_12.m_data[2] = 0.0;
                              res_12.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(res_8.m_data[lVar26] <= res_11.m_data[lVar26]);
                                res_12.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_11.m_data[lVar26] |
                                            (uint)res_8.m_data[lVar26] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(res_5.m_data[lVar26] <= res_12.m_data[lVar26]);
                                res.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_12.m_data[lVar26] |
                                            (uint)res_5.m_data[lVar26] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(maxVal.m_data[lVar26] <= res.m_data[lVar26]);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)maxVal.m_data[lVar26] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              minVal.m_data[0] = 0.0;
                              minVal.m_data[1] = 0.0;
                              minVal.m_data[2] = 0.0;
                              minVal.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                minVal.m_data[lVar26] =
                                     res_1.m_data[lVar26] - (prec->colorThreshold).m_data[lVar26];
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad00.p01.m_data[lVar26];
                                fVar48 = quad00.p11.m_data[lVar26];
                                uVar35 = -(uint)(fVar48 <= fVar65);
                                res.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)fVar48 | (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad00.p10.m_data[lVar26];
                                uVar35 = -(uint)(res.m_data[lVar26] <= fVar65);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_5.m_data[0] = 0.0;
                              res_5.m_data[1] = 0.0;
                              res_5.m_data[2] = 0.0;
                              res_5.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad00.p00.m_data[lVar26];
                                uVar35 = -(uint)(res_1.m_data[lVar26] <= fVar65);
                                res_5.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_1.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad01.p01.m_data[lVar26];
                                fVar48 = quad01.p11.m_data[lVar26];
                                uVar35 = -(uint)(fVar48 <= fVar65);
                                res.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)fVar48 | (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad01.p10.m_data[lVar26];
                                uVar35 = -(uint)(res.m_data[lVar26] <= fVar65);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_12.m_data[0] = 0.0;
                              res_12.m_data[1] = 0.0;
                              res_12.m_data[2] = 0.0;
                              res_12.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad01.p00.m_data[lVar26];
                                uVar35 = -(uint)(res_1.m_data[lVar26] <= fVar65);
                                res_12.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_1.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 4;
                              do {
                                fVar65 = quad10.p00.m_data[lVar26];
                                fVar48 = quad10.p10.m_data[lVar26];
                                uVar35 = -(uint)(fVar48 <= fVar65);
                                auStack_528[lVar26] = ~uVar35 & (uint)fVar48 | (uint)fVar65 & uVar35
                                ;
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 8);
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad10.p10.m_data[lVar26];
                                uVar35 = -(uint)(res.m_data[lVar26] <= fVar65);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_11.m_data[0] = 0.0;
                              res_11.m_data[1] = 0.0;
                              res_11.m_data[2] = 0.0;
                              res_11.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                fVar65 = quad10.p00.m_data[lVar26];
                                uVar35 = -(uint)(res_1.m_data[lVar26] <= fVar65);
                                res_11.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_1.m_data[lVar26] |
                                            (uint)fVar65 & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 4;
                              do {
                                uVar35 = -(uint)(local_138[lVar26 + 4] <= uBounds0_1.m_data[lVar26])
                                ;
                                auStack_528[lVar26] =
                                     ~uVar35 & (uint)local_138[lVar26 + 4] |
                                     (uint)uBounds0_1.m_data[lVar26] & uVar35;
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 8);
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(res.m_data[lVar26] <= local_138[lVar26 + 4]);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)local_138[lVar26 + 4] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_27.m_data[0] = 0.0;
                              res_27.m_data[1] = 0.0;
                              res_27.m_data[2] = 0.0;
                              res_27.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(res_1.m_data[lVar26] <= uBounds0_1.m_data[lVar26]);
                                res_27.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_1.m_data[lVar26] |
                                            (uint)uBounds0_1.m_data[lVar26] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_8.m_data[0] = 0.0;
                              res_8.m_data[1] = 0.0;
                              res_8.m_data[2] = 0.0;
                              res_8.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(res_27.m_data[lVar26] <= res_11.m_data[lVar26]);
                                res_8.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_27.m_data[lVar26] |
                                            (uint)res_11.m_data[lVar26] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data[0] = 0.0;
                              res.m_data[1] = 0.0;
                              res.m_data[2] = 0.0;
                              res.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(res_8.m_data[lVar26] <= res_12.m_data[lVar26]);
                                res.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res_8.m_data[lVar26] |
                                            (uint)res_12.m_data[lVar26] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_1.m_data[0] = 0.0;
                              res_1.m_data[1] = 0.0;
                              res_1.m_data[2] = 0.0;
                              res_1.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                uVar35 = -(uint)(res.m_data[lVar26] <= res_5.m_data[lVar26]);
                                res_1.m_data[lVar26] =
                                     (float)(~uVar35 & (uint)res.m_data[lVar26] |
                                            (uint)res_5.m_data[lVar26] & uVar35);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              maxVal.m_data[0] = 0.0;
                              maxVal.m_data[1] = 0.0;
                              maxVal.m_data[2] = 0.0;
                              maxVal.m_data[3] = 0.0;
                              lVar26 = 0;
                              do {
                                maxVal.m_data[lVar26] =
                                     res_1.m_data[lVar26] + (prec->colorThreshold).m_data[lVar26];
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_5.m_data._0_8_ = res_5.m_data._0_8_ & 0xffffffff00000000;
                              lVar26 = 0;
                              do {
                                *(bool *)((long)res_5.m_data + lVar26) =
                                     minVal.m_data[lVar26] <= result->m_data[lVar26];
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_12.m_data._0_8_ = res_12.m_data._0_8_ & 0xffffffff00000000;
                              lVar26 = 0;
                              do {
                                *(bool *)((long)res_12.m_data + lVar26) =
                                     result->m_data[lVar26] <= maxVal.m_data[lVar26];
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res.m_data._0_8_ = res.m_data._0_8_ & 0xffffffff00000000;
                              lVar26 = 0;
                              do {
                                *(byte *)((long)res.m_data + lVar26) =
                                     *(byte *)((long)res_12.m_data + lVar26) &
                                     *(byte *)((long)res_5.m_data + lVar26);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_8.m_data._0_8_ = res_8.m_data._0_8_ & 0xffffffff00000000;
                              lVar26 = 0;
                              do {
                                *(byte *)((long)res_8.m_data + lVar26) =
                                     (prec->colorMask).m_data[lVar26] ^ 1;
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              res_1.m_data._0_8_ = res_1.m_data._0_8_ & 0xffffffff00000000;
                              lVar26 = 0;
                              do {
                                *(byte *)((long)res_1.m_data + lVar26) =
                                     *(byte *)((long)res_8.m_data + lVar26) |
                                     *(byte *)((long)res.m_data + lVar26);
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != 4);
                              if (res_1.m_data[0]._0_1_ != '\0') {
                                local_e8 = ZEXT416(~-(uint)(fVar62 < 0.0) & (uint)fVar61);
                                fVar64 = (float)(~-(uint)(fVar63 < 0.0) & (uint)fVar64);
                                fVar43 = (float)(~-(uint)(local_78 <= fVar43) & (uint)fVar43 |
                                                -(uint)(local_78 <= fVar43) & (uint)local_78);
                                uVar27 = 0xffffffffffffffff;
                                do {
                                  if (uVar27 == 2) {
                                    uVar29 = 3;
                                    break;
                                  }
                                  uVar29 = uVar27 + 1;
                                  lVar26 = uVar27 + 2;
                                  uVar27 = uVar29;
                                } while (*(char *)((long)res_1.m_data + lVar26) != '\0');
                                if (2 < uVar29) {
                                  fVar61 = (float)local_68._0_4_ + fVar43;
                                  if ((float)local_88._0_4_ < fVar61) {
                                    fVar62 = (float)local_108._0_4_ + fVar43;
                                    fVar63 = local_f8 + fVar43;
                                    local_51c = fVar43 + fVar66;
                                    local_b8 = local_88._0_8_;
                                    uStack_b0 = local_88._8_8_;
                                    do {
                                      if (fVar38 < fVar62) {
                                        fVar58 = (float)(~-(uint)((float)local_b8 <=
                                                                 (float)local_68._0_4_) &
                                                         local_68._0_4_ |
                                                        -(uint)((float)local_b8 <=
                                                               (float)local_68._0_4_) &
                                                        (uint)(float)local_b8);
                                        fVar48 = 1.0 - fVar58;
                                        fVar65 = fVar38;
                                        do {
                                          res_5.m_data[0] = 0.0;
                                          res_5.m_data[1] = 0.0;
                                          res_5.m_data[2] = 0.0;
                                          res_5.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_5.m_data[lVar26] =
                                                 quad00.p00.m_data[lVar26] * fVar48;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          fVar49 = (float)(~-(uint)(fVar65 <= (float)local_108._0_4_
                                                                   ) & local_108._0_4_ |
                                                          -(uint)(fVar65 <= (float)local_108._0_4_)
                                                          & (uint)fVar65);
                                          fVar55 = 1.0 - fVar49;
                                          maxVal.m_data[0] = 0.0;
                                          maxVal.m_data[1] = 0.0;
                                          maxVal.m_data[2] = 0.0;
                                          maxVal.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            maxVal.m_data[lVar26] = res_5.m_data[lVar26] * fVar55;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_8.m_data[0] = 0.0;
                                          res_8.m_data[1] = 0.0;
                                          res_8.m_data[2] = 0.0;
                                          res_8.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_8.m_data[lVar26] =
                                                 quad00.p10.m_data[lVar26] * fVar58;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_12.m_data[0] = 0.0;
                                          res_12.m_data[1] = 0.0;
                                          res_12.m_data[2] = 0.0;
                                          res_12.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_12.m_data[lVar26] = res_8.m_data[lVar26] * fVar55;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          minVal.m_data[0] = 0.0;
                                          minVal.m_data[1] = 0.0;
                                          minVal.m_data[2] = 0.0;
                                          minVal.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            minVal.m_data[lVar26] =
                                                 maxVal.m_data[lVar26] + res_12.m_data[lVar26];
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_27.m_data[0] = 0.0;
                                          res_27.m_data[1] = 0.0;
                                          res_27.m_data[2] = 0.0;
                                          res_27.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_27.m_data[lVar26] =
                                                 quad00.p01.m_data[lVar26] * fVar48;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_11.m_data[0] = 0.0;
                                          res_11.m_data[1] = 0.0;
                                          res_11.m_data[2] = 0.0;
                                          res_11.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_11.m_data[lVar26] = res_27.m_data[lVar26] * fVar49;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res.m_data[0] = 0.0;
                                          res.m_data[1] = 0.0;
                                          res.m_data[2] = 0.0;
                                          res.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res.m_data[lVar26] =
                                                 minVal.m_data[lVar26] + res_11.m_data[lVar26];
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_45.m_data[0] = 0.0;
                                          res_45.m_data[1] = 0.0;
                                          res_45.m_data[2] = 0.0;
                                          res_45.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_45.m_data[lVar26] =
                                                 quad00.p11.m_data[lVar26] * fVar58;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_46.m_data[0] = 0.0;
                                          res_46.m_data[1] = 0.0;
                                          res_46.m_data[2] = 0.0;
                                          res_46.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_46.m_data[lVar26] = res_45.m_data[lVar26] * fVar49;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_1.m_data[0] = 0.0;
                                          res_1.m_data[1] = 0.0;
                                          res_1.m_data[2] = 0.0;
                                          res_1.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_1.m_data[lVar26] =
                                                 res.m_data[lVar26] + res_46.m_data[lVar26];
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_12.m_data[0] = 0.0;
                                          res_12.m_data[1] = 0.0;
                                          res_12.m_data[2] = 0.0;
                                          res_12.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_12.m_data[lVar26] =
                                                 quad01.p00.m_data[lVar26] * fVar48;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_5.m_data[0] = 0.0;
                                          res_5.m_data[1] = 0.0;
                                          res_5.m_data[2] = 0.0;
                                          res_5.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_5.m_data[lVar26] = res_12.m_data[lVar26] * fVar55;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_11.m_data[0] = 0.0;
                                          res_11.m_data[1] = 0.0;
                                          res_11.m_data[2] = 0.0;
                                          res_11.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_11.m_data[lVar26] =
                                                 quad01.p10.m_data[lVar26] * fVar58;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_8.m_data[0] = 0.0;
                                          res_8.m_data[1] = 0.0;
                                          res_8.m_data[2] = 0.0;
                                          res_8.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_8.m_data[lVar26] = res_11.m_data[lVar26] * fVar55;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          maxVal.m_data[0] = 0.0;
                                          maxVal.m_data[1] = 0.0;
                                          maxVal.m_data[2] = 0.0;
                                          maxVal.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            maxVal.m_data[lVar26] =
                                                 res_5.m_data[lVar26] + res_8.m_data[lVar26];
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_46.m_data[0] = 0.0;
                                          res_46.m_data[1] = 0.0;
                                          res_46.m_data[2] = 0.0;
                                          res_46.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_46.m_data[lVar26] =
                                                 quad01.p01.m_data[lVar26] * fVar48;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_27.m_data[0] = 0.0;
                                          res_27.m_data[1] = 0.0;
                                          res_27.m_data[2] = 0.0;
                                          res_27.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_27.m_data[lVar26] = res_46.m_data[lVar26] * fVar49;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          minVal.m_data[0] = 0.0;
                                          minVal.m_data[1] = 0.0;
                                          minVal.m_data[2] = 0.0;
                                          minVal.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            minVal.m_data[lVar26] =
                                                 maxVal.m_data[lVar26] + res_27.m_data[lVar26];
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_56.m_data[0] = 0.0;
                                          res_56.m_data[1] = 0.0;
                                          res_56.m_data[2] = 0.0;
                                          res_56.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_56.m_data[lVar26] =
                                                 quad01.p11.m_data[lVar26] * fVar58;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res_45.m_data[0] = 0.0;
                                          res_45.m_data[1] = 0.0;
                                          res_45.m_data[2] = 0.0;
                                          res_45.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res_45.m_data[lVar26] = res_56.m_data[lVar26] * fVar49;
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          res.m_data[0] = 0.0;
                                          res.m_data[1] = 0.0;
                                          res.m_data[2] = 0.0;
                                          res.m_data[3] = 0.0;
                                          lVar26 = 0;
                                          do {
                                            res.m_data[lVar26] =
                                                 minVal.m_data[lVar26] + res_45.m_data[lVar26];
                                            lVar26 = lVar26 + 1;
                                          } while (lVar26 != 4);
                                          uStack_3c = 0;
                                          fVar55 = (float)(~-(uint)(fVar39 < 0.0) & auVar54._0_4_);
                                          uVar10 = auVar54._8_4_;
                                          uVar11 = uStack_3c;
                                          fVar49 = local_d8;
                                          uVar4 = uStack_d4;
                                          uVar5 = uStack_d0;
                                          uVar6 = uStack_cc;
                                          uVar7 = uStack_c4;
                                          uVar8 = uStack_c0;
                                          uVar9 = uStack_bc;
                                          uStack_d4 = 0;
                                          while (uStack_cc = uVar11, uStack_d0 = uVar10,
                                                local_d8 = fVar55, local_d8 < fVar63) {
                                            fVar49 = (float)(~-(uint)(local_d8 <= local_f8) &
                                                             (uint)local_f8 |
                                                            -(uint)(local_d8 <= local_f8) &
                                                            (uint)local_d8);
                                            maxVal.m_data[0] = 0.0;
                                            maxVal.m_data[1] = 0.0;
                                            maxVal.m_data[2] = 0.0;
                                            maxVal.m_data[3] = 0.0;
                                            lVar26 = 0;
                                            do {
                                              maxVal.m_data[lVar26] =
                                                   res_1.m_data[lVar26] * (1.0 - fVar49);
                                              lVar26 = lVar26 + 1;
                                            } while (lVar26 != 4);
                                            res_5.m_data[0] = 0.0;
                                            res_5.m_data[1] = 0.0;
                                            res_5.m_data[2] = 0.0;
                                            res_5.m_data[3] = 0.0;
                                            lVar26 = 0;
                                            do {
                                              res_5.m_data[lVar26] = res.m_data[lVar26] * fVar49;
                                              lVar26 = lVar26 + 1;
                                            } while (lVar26 != 4);
                                            minVal.m_data[0] = 0.0;
                                            minVal.m_data[1] = 0.0;
                                            minVal.m_data[2] = 0.0;
                                            minVal.m_data[3] = 0.0;
                                            lVar26 = 0;
                                            do {
                                              minVal.m_data[lVar26] =
                                                   maxVal.m_data[lVar26] + res_5.m_data[lVar26];
                                              lVar26 = lVar26 + 1;
                                            } while (lVar26 != 4);
                                            fVar49 = (float)local_e8._0_4_;
                                            uStack_c4 = local_e8._4_4_;
                                            uStack_c0 = local_e8._8_4_;
                                            uStack_bc = local_e8._12_4_;
                                            if (fVar43 + fVar64 <= (float)local_e8._0_4_) {
                                              iVar21 = 0xb;
                                              uStack_c4 = uVar7;
                                              uStack_c0 = uVar8;
                                              uStack_bc = uVar9;
                                            }
                                            else {
                                              do {
                                                local_c8 = fVar49;
                                                if (fVar47 < local_51c) {
                                                  fVar55 = (float)(~-(uint)(fVar49 <= fVar64) &
                                                                   (uint)fVar64 |
                                                                  -(uint)(fVar49 <= fVar64) &
                                                                  (uint)fVar49);
                                                  fVar60 = 1.0 - fVar55;
                                                  fVar49 = fVar47;
                                                  do {
                                                    res_11.m_data[0] = 0.0;
                                                    res_11.m_data[1] = 0.0;
                                                    res_11.m_data[2] = 0.0;
                                                    res_11.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_11.m_data[lVar26] =
                                                           quad10.p00.m_data[lVar26] * fVar60;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    fVar50 = (float)(~-(uint)(fVar49 <= fVar66) &
                                                                     (uint)fVar66 |
                                                                    -(uint)(fVar49 <= fVar66) &
                                                                    (uint)fVar49);
                                                    fVar56 = 1.0 - fVar50;
                                                    res_8.m_data[0] = 0.0;
                                                    res_8.m_data[1] = 0.0;
                                                    res_8.m_data[2] = 0.0;
                                                    res_8.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_8.m_data[lVar26] =
                                                           res_11.m_data[lVar26] * fVar56;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_46.m_data[0] = 0.0;
                                                    res_46.m_data[1] = 0.0;
                                                    res_46.m_data[2] = 0.0;
                                                    res_46.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_46.m_data[lVar26] =
                                                           quad10.p10.m_data[lVar26] * fVar55;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_27.m_data[0] = 0.0;
                                                    res_27.m_data[1] = 0.0;
                                                    res_27.m_data[2] = 0.0;
                                                    res_27.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_27.m_data[lVar26] =
                                                           res_46.m_data[lVar26] * fVar56;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_12.m_data[0] = 0.0;
                                                    res_12.m_data[1] = 0.0;
                                                    res_12.m_data[2] = 0.0;
                                                    res_12.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_12.m_data[lVar26] =
                                                           res_8.m_data[lVar26] +
                                                           res_27.m_data[lVar26];
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_56.m_data[0] = 0.0;
                                                    res_56.m_data[1] = 0.0;
                                                    res_56.m_data[2] = 0.0;
                                                    res_56.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_56.m_data[lVar26] =
                                                           quad10.p01.m_data[lVar26] * fVar60;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_45.m_data[0] = 0.0;
                                                    res_45.m_data[1] = 0.0;
                                                    res_45.m_data[2] = 0.0;
                                                    res_45.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_45.m_data[lVar26] =
                                                           res_56.m_data[lVar26] * fVar50;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_5.m_data[0] = 0.0;
                                                    res_5.m_data[1] = 0.0;
                                                    res_5.m_data[2] = 0.0;
                                                    res_5.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_5.m_data[lVar26] =
                                                           res_12.m_data[lVar26] +
                                                           res_45.m_data[lVar26];
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_70.m_data[0] = 0.0;
                                                    res_70.m_data[1] = 0.0;
                                                    res_70.m_data[2] = 0.0;
                                                    res_70.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_70.m_data[lVar26] =
                                                           quad10.p11.m_data[lVar26] * fVar55;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_71.m_data[0] = 0.0;
                                                    res_71.m_data[1] = 0.0;
                                                    res_71.m_data[2] = 0.0;
                                                    res_71.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_71.m_data[lVar26] =
                                                           res_70.m_data[lVar26] * fVar50;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    maxVal.m_data[0] = 0.0;
                                                    maxVal.m_data[1] = 0.0;
                                                    maxVal.m_data[2] = 0.0;
                                                    maxVal.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      maxVal.m_data[lVar26] =
                                                           res_5.m_data[lVar26] +
                                                           res_71.m_data[lVar26];
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_27.m_data[0] = 0.0;
                                                    res_27.m_data[1] = 0.0;
                                                    res_27.m_data[2] = 0.0;
                                                    res_27.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_27.m_data[lVar26] =
                                                           uBounds0_1.m_data[lVar26] * fVar60;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_11.m_data[0] = 0.0;
                                                    res_11.m_data[1] = 0.0;
                                                    res_11.m_data[2] = 0.0;
                                                    res_11.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_11.m_data[lVar26] =
                                                           res_27.m_data[lVar26] * fVar56;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_45.m_data[0] = 0.0;
                                                    res_45.m_data[1] = 0.0;
                                                    res_45.m_data[2] = 0.0;
                                                    res_45.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_45.m_data[lVar26] =
                                                           local_138[lVar26 + 4] * fVar55;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_46.m_data[0] = 0.0;
                                                    res_46.m_data[1] = 0.0;
                                                    res_46.m_data[2] = 0.0;
                                                    res_46.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_46.m_data[lVar26] =
                                                           res_45.m_data[lVar26] * fVar56;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_8.m_data[0] = 0.0;
                                                    res_8.m_data[1] = 0.0;
                                                    res_8.m_data[2] = 0.0;
                                                    res_8.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_8.m_data[lVar26] =
                                                           res_11.m_data[lVar26] +
                                                           res_46.m_data[lVar26];
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_71.m_data[0] = 0.0;
                                                    res_71.m_data[1] = 0.0;
                                                    res_71.m_data[2] = 0.0;
                                                    res_71.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_71.m_data[lVar26] =
                                                           local_138[lVar26] * fVar60;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_56.m_data[0] = 0.0;
                                                    res_56.m_data[1] = 0.0;
                                                    res_56.m_data[2] = 0.0;
                                                    res_56.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_56.m_data[lVar26] =
                                                           res_71.m_data[lVar26] * fVar50;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_12.m_data[0] = 0.0;
                                                    res_12.m_data[1] = 0.0;
                                                    res_12.m_data[2] = 0.0;
                                                    res_12.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_12.m_data[lVar26] =
                                                           res_8.m_data[lVar26] +
                                                           res_56.m_data[lVar26];
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_81.m_data[0] = 0.0;
                                                    res_81.m_data[1] = 0.0;
                                                    res_81.m_data[2] = 0.0;
                                                    res_81.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_81.m_data[lVar26] =
                                                           local_138[lVar26 + 8] * fVar55;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_70.m_data[0] = 0.0;
                                                    res_70.m_data[1] = 0.0;
                                                    res_70.m_data[2] = 0.0;
                                                    res_70.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_70.m_data[lVar26] =
                                                           res_81.m_data[lVar26] * fVar50;
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    res_5.m_data[0] = 0.0;
                                                    res_5.m_data[1] = 0.0;
                                                    res_5.m_data[2] = 0.0;
                                                    res_5.m_data[3] = 0.0;
                                                    lVar26 = 0;
                                                    do {
                                                      res_5.m_data[lVar26] =
                                                           res_12.m_data[lVar26] +
                                                           res_70.m_data[lVar26];
                                                      lVar26 = lVar26 + 1;
                                                    } while (lVar26 != 4);
                                                    iVar21 = 0;
                                                    for (fVar50 = (float)(~-(uint)(fVar67 < 0.0) &
                                                                         (uint)fVar3);
                                                        fVar50 < fVar43 + fVar59;
                                                        fVar50 = fVar50 + fVar43) {
                                                      fVar56 = (float)(~-(uint)(fVar50 <= fVar59) &
                                                                       (uint)fVar59 |
                                                                      -(uint)(fVar50 <= fVar59) &
                                                                      (uint)fVar50);
                                                      res_8.m_data[0] = 0.0;
                                                      res_8.m_data[1] = 0.0;
                                                      res_8.m_data[2] = 0.0;
                                                      res_8.m_data[3] = 0.0;
                                                      lVar26 = 0;
                                                      do {
                                                        res_8.m_data[lVar26] =
                                                             maxVal.m_data[lVar26] * (1.0 - fVar56);
                                                        lVar26 = lVar26 + 1;
                                                      } while (lVar26 != 4);
                                                      res_11.m_data[0] = 0.0;
                                                      res_11.m_data[1] = 0.0;
                                                      res_11.m_data[2] = 0.0;
                                                      res_11.m_data[3] = 0.0;
                                                      lVar26 = 0;
                                                      do {
                                                        res_11.m_data[lVar26] =
                                                             res_5.m_data[lVar26] * fVar56;
                                                        lVar26 = lVar26 + 1;
                                                      } while (lVar26 != 4);
                                                      res_12.m_data[0] = 0.0;
                                                      res_12.m_data[1] = 0.0;
                                                      res_12.m_data[2] = 0.0;
                                                      res_12.m_data[3] = 0.0;
                                                      lVar26 = 0;
                                                      do {
                                                        res_12.m_data[lVar26] =
                                                             res_8.m_data[lVar26] +
                                                             res_11.m_data[lVar26];
                                                        lVar26 = lVar26 + 1;
                                                      } while (lVar26 != 4);
                                                      bVar13 = isLinearRangeValid(prec,&minVal,
                                                                                  &res_12,&local_310
                                                                                  ,result);
                                                      if (bVar13) {
                                                        iVar21 = 1;
                                                        break;
                                                      }
                                                    }
                                                    if (fVar50 < fVar43 + fVar59) goto LAB_00abb1f1;
                                                    fVar49 = fVar49 + fVar43;
                                                  } while (fVar49 < local_51c);
                                                }
                                                iVar21 = 0xe;
LAB_00abb1f1:
                                                if (iVar21 != 0xe) goto LAB_00abb235;
                                                fVar49 = local_c8 + fVar43;
                                              } while (local_c8 + fVar43 < fVar43 + fVar64);
                                              iVar21 = 0xb;
                                            }
LAB_00abb235:
                                            if (iVar21 == 0xb) {
                                              iVar21 = 0;
                                            }
                                            if (iVar21 != 0) goto LAB_00abb272;
                                            uVar10 = uStack_d0;
                                            uVar11 = uStack_cc;
                                            fVar49 = local_d8;
                                            uVar4 = uStack_d4;
                                            uVar5 = uStack_d0;
                                            uVar6 = uStack_cc;
                                            uVar7 = uStack_c4;
                                            uVar8 = uStack_c0;
                                            uVar9 = uStack_bc;
                                            fVar55 = local_d8 + fVar43;
                                          }
                                          iVar21 = 8;
                                          local_d8 = fVar49;
                                          uStack_d4 = uVar4;
                                          uStack_d0 = uVar5;
                                          uStack_cc = uVar6;
                                          uStack_c4 = uVar7;
                                          uStack_c0 = uVar8;
                                          uStack_bc = uVar9;
LAB_00abb272:
                                          if (iVar21 != 8) goto LAB_00abb2aa;
                                          fVar65 = fVar65 + fVar43;
                                        } while (fVar65 < fVar62);
                                      }
                                      iVar21 = 5;
LAB_00abb2aa:
                                      if (iVar21 != 5) goto LAB_00abb2de;
                                      local_b8._0_4_ = (float)local_b8 + fVar43;
                                    } while ((float)local_b8 < fVar61);
                                    iVar21 = 2;
LAB_00abb2de:
                                    if (iVar21 != 2) {
                                      local_434 = 1;
                                      break;
                                    }
                                  }
                                }
                              }
                              bVar12 = iVar28 < c;
                              iVar21 = c;
                            } while (c <= iVar28);
                          }
                          if (!bVar12) goto LAB_00ab9a05;
                          iVar20 = iVar20 + 1;
                        } while (iVar20 <= (int)fVar42);
                      }
                      local_434 = 0xe;
LAB_00ab9a05:
                      if (local_434 != 0xe) goto LAB_00abb358;
                      iVar19 = iVar19 + 1;
                    } while (iVar19 <= (int)fVar46);
                    local_434 = 0xb;
                  }
LAB_00abb358:
                  local_364 = local_364 + 1;
                } while (local_434 == 0xb);
                if (local_434 != 8) goto LAB_00abb386;
                uVar32 = uVar14;
              } while ((int)uVar14 <= iVar30);
            }
            local_434 = 5;
LAB_00abb386:
            if (local_434 != 5) goto LAB_00abb3b2;
            iVar17 = iVar17 + 1;
          } while (iVar17 <= (int)fVar44);
          local_434 = 2;
          goto LAB_00abb3b2;
        }
LAB_00ab9585:
        bVar12 = false;
      }
      else {
        iVar33 = (level->m_size).m_data[0];
        iVar34 = (level->m_size).m_data[1];
        iVar25 = (level_00->m_size).m_data[0];
        iVar1 = (level_00->m_size).m_data[1];
        local_c8 = (float)(level->m_size).m_data[2];
        iVar2 = (level_00->m_size).m_data[2];
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&uBounds0_1,sampler->normalizedCoords,iVar33,coord->m_data[0],
                   (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&res_1,sampler->normalizedCoords,iVar25,coord->m_data[0],
                   (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&res,sampler->normalizedCoords,iVar34,coord->m_data[1],
                   (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&minVal,sampler->normalizedCoords,iVar1,coord->m_data[1],
                   (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&maxVal,sampler->normalizedCoords,(int)local_c8,
                   coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&res_5,sampler->normalizedCoords,iVar2,coord->m_data[2],
                   (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
        fVar36 = uBounds0_1.m_data[1];
        fVar37 = floorf(uBounds0_1.m_data[0]);
        fVar38 = floorf(fVar36);
        fVar36 = res_1.m_data[1];
        fVar39 = floorf(res_1.m_data[0]);
        fVar40 = floorf(fVar36);
        fVar36 = res.m_data[1];
        fVar41 = floorf(res.m_data[0]);
        fVar42 = floorf(fVar36);
        fVar36 = minVal.m_data[1];
        local_51c = floorf(minVal.m_data[0]);
        fVar43 = floorf(fVar36);
        fVar36 = maxVal.m_data[1];
        fVar44 = floorf(maxVal.m_data[0]);
        local_3c8._0_4_ = (int)fVar44;
        fVar45 = floorf(fVar36);
        fVar36 = res_5.m_data[1];
        fVar46 = floorf(res_5.m_data[0]);
        fVar36 = floorf(fVar36);
        if ((int)fVar45 < (int)fVar44) goto LAB_00ab9585;
        local_108._0_4_ = (int)fVar45;
        local_f8 = (float)(int)local_51c;
        local_d8 = (float)(int)fVar43;
        local_e8._0_4_ = (int)fVar36;
        fVar36 = (float)(int)fVar41;
LAB_00ab921f:
        do {
          iVar16 = (int)fVar37;
          local_51c = fVar36;
          if ((int)fVar42 < (int)fVar36) {
            local_434 = 5;
          }
          else {
            for (; iVar17 = (int)fVar46, iVar16 <= (int)fVar38; iVar16 = iVar16 + 1) {
              for (; fVar36 = local_f8, iVar17 <= (int)local_e8._0_4_; iVar17 = iVar17 + 1) {
                for (; iVar18 = (int)fVar39, (int)fVar36 <= (int)local_d8;
                    fVar36 = (float)((int)fVar36 + 1)) {
                  for (; iVar18 <= (int)fVar40; iVar18 = iVar18 + 1) {
                    iVar28 = TexVerifierUtil::wrap(sampler->wrapS,iVar16,iVar33);
                    iVar30 = TexVerifierUtil::wrap(sampler->wrapT,(int)local_51c,iVar34);
                    iVar19 = TexVerifierUtil::wrap(sampler->wrapR,local_3c8._0_4_,(int)local_c8);
                    if ((((iVar28 < 0) || ((level->m_size).m_data[0] <= iVar28)) || (iVar30 < 0)) ||
                       ((((level->m_size).m_data[1] <= iVar30 || (iVar19 < 0)) ||
                        ((level->m_size).m_data[2] <= iVar19)))) {
                      sampleTextureBorder<float>((tcu *)&quad01,&level->m_format,sampler);
                    }
                    else {
                      ConstPixelBufferAccess::getPixel
                                ((ConstPixelBufferAccess *)&quad00,(int)level,iVar28,iVar30);
                      bVar12 = isSRGB(level->m_format);
                      if (bVar12) {
                        sRGBToLinear((tcu *)&quad01,&quad00.p00);
                      }
                      else {
                        quad01.p00.m_data[0] = quad00.p00.m_data[0];
                        quad01.p00.m_data[1] = quad00.p00.m_data[1];
                        quad01.p00.m_data[2] = quad00.p00.m_data[2];
                        quad01.p00.m_data[3] = quad00.p00.m_data[3];
                      }
                    }
                    iVar28 = TexVerifierUtil::wrap(sampler->wrapS,iVar18,iVar25);
                    iVar30 = TexVerifierUtil::wrap(sampler->wrapT,(int)fVar36,iVar1);
                    iVar19 = TexVerifierUtil::wrap(sampler->wrapR,iVar17,iVar2);
                    if (((iVar28 < 0) || ((level_00->m_size).m_data[0] <= iVar28)) ||
                       ((iVar30 < 0 ||
                        ((((level_00->m_size).m_data[1] <= iVar30 || (iVar19 < 0)) ||
                         ((level_00->m_size).m_data[2] <= iVar19)))))) {
                      sampleTextureBorder<float>((tcu *)&quad10,&level_00->m_format,sampler);
                    }
                    else {
                      ConstPixelBufferAccess::getPixel
                                ((ConstPixelBufferAccess *)&quad00,(int)level_00,iVar28,iVar30);
                      bVar12 = isSRGB(level_00->m_format);
                      if (bVar12) {
                        sRGBToLinear((tcu *)&quad10,&quad00.p00);
                      }
                      else {
                        quad10.p00.m_data[0] = quad00.p00.m_data[0];
                        quad10.p00.m_data[1] = quad00.p00.m_data[1];
                        quad10.p00.m_data[2] = quad00.p00.m_data[2];
                        quad10.p00.m_data[3] = quad00.p00.m_data[3];
                      }
                    }
                    bVar12 = isLinearRangeValid(prec,&quad01.p00,&quad10.p00,&local_310,result);
                    if (bVar12) {
                      local_434 = 1;
                      goto LAB_00ab94cc;
                    }
                  }
                  local_434 = 0x11;
LAB_00ab94cc:
                  if (iVar18 <= (int)fVar40) goto LAB_00ab94e1;
                }
                local_434 = 0xe;
LAB_00ab94e1:
                if (local_434 != 0xe) goto LAB_00ab94f9;
              }
              local_434 = 0xb;
LAB_00ab94f9:
              if (local_434 != 0xb) goto LAB_00ab9511;
            }
            local_434 = 8;
LAB_00ab9511:
            if (local_434 == 8) {
              fVar36 = (float)((int)local_51c + 1);
              goto LAB_00ab921f;
            }
          }
          if (local_434 != 5) goto LAB_00abb3b2;
          iVar16 = local_3c8._0_4_ + 1;
          local_3c8._0_4_ = iVar16;
          fVar36 = (float)(int)fVar41;
        } while (iVar16 <= (int)local_108._0_4_);
        local_434 = 2;
LAB_00abb3b2:
        bVar12 = local_434 != 2;
      }
      iVar33 = (int)local_98;
    } while (!bVar12);
    bVar12 = true;
LAB_00abb4a0:
    if ((int)(uint)local_a0 <= iVar33) goto LAB_00abb4a7;
  }
  bVar12 = false;
LAB_00abb4a7:
  if (!bVar12) {
    return false;
  }
  return true;
}

Assistant:

bool isLookupResultValid (const Texture3DView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel <= maxTexLevel);

		if (isLinearMipmap && minTexLevel < maxTexLevel)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, Vec2(minF, maxF), result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, result))
					return true;
			}
		}
		else
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, result))
				return true;
		}
	}

	return false;
}